

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Model * gvr::loadModel(char *name,char *spath,bool verbose,bool merge_double_vertices)

{
  long lVar1;
  Model *pMVar2;
  allocator local_49;
  string s;
  
  std::__cxx11::string::string((string *)&s,name,&local_49);
  lVar1 = std::__cxx11::string::rfind((char *)&s,0x1266f8);
  if (lVar1 != s._M_string_length - 4) {
    lVar1 = std::__cxx11::string::rfind((char *)&s,0x1266fd);
    if (lVar1 != s._M_string_length - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&s,0x126702);
      if (lVar1 != s._M_string_length - 4) {
        lVar1 = std::__cxx11::string::rfind((char *)&s,0x126707);
        if (lVar1 != s._M_string_length - 4) {
          pMVar2 = loadDepth(name,spath,verbose);
          goto LAB_00115744;
        }
      }
      pMVar2 = loadPLY(name);
      goto LAB_00115744;
    }
  }
  pMVar2 = loadSTL(name,merge_double_vertices);
LAB_00115744:
  std::__cxx11::string::~string((string *)&s);
  return pMVar2;
}

Assistant:

Model *loadModel(const char *name, const char *spath, bool verbose, bool merge_double_vertices)
{
  std::string s=name;

  if (s.rfind(".stl") == s.size()-4 || s.rfind(".STL") == s.size()-4)
  {
    return loadSTL(name, merge_double_vertices);
  }
  else if (s.rfind(".ply") == s.size()-4 || s.rfind(".PLY") == s.size()-4)
  {
    return loadPLY(name);
  }

  return loadDepth(name, spath, verbose);
}